

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O3

chunk_conflict * chunk_write(chunk_conflict *c)

{
  bitflag *flags1;
  chunk_conflict *c_00;
  loc lVar1;
  square *psVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int y;
  long lVar7;
  
  c_00 = cave_new(c->height,c->width);
  iVar5 = c_00->height;
  if (0 < iVar5) {
    uVar3 = (ulong)(uint)c_00->width;
    lVar7 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar4 = 0;
        lVar6 = 0;
        do {
          iVar5 = (int)lVar6;
          y = (int)lVar7;
          lVar1 = (loc)loc(iVar5,y);
          psVar2 = square(c,lVar1);
          (&c_00->squares[lVar7]->feat)[lVar4] = psVar2->feat;
          lVar1 = (loc)loc(iVar5,y);
          psVar2 = square(c_00,lVar1);
          flags1 = psVar2->info;
          lVar1 = (loc)loc(iVar5,y);
          psVar2 = square(c,lVar1);
          flag_copy(flags1,psVar2->info,3);
          lVar6 = lVar6 + 1;
          uVar3 = (ulong)c_00->width;
          lVar4 = lVar4 + 0x28;
        } while (lVar6 < (long)uVar3);
        iVar5 = c_00->height;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  return c_00;
}

Assistant:

struct chunk *chunk_write(struct chunk *c)
{
	int x, y;

	struct chunk *new = cave_new(c->height, c->width);

	/* Write the location stuff */
	for (y = 0; y < new->height; y++) {
		for (x = 0; x < new->width; x++) {
			/* Terrain */
			new->squares[y][x].feat = square(c, loc(x, y))->feat;
			sqinfo_copy(square(new, loc(x, y))->info, square(c, loc(x, y))->info);
		}
	}

	return new;
}